

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.c
# Opt level: O0

void * nni_plat_thr_main(void *arg)

{
  undefined1 local_98 [8];
  sigset_t set;
  nni_plat_thr *thr;
  void *arg_local;
  
  set.__val[0xf] = (unsigned_long)arg;
  sigemptyset((sigset_t *)local_98);
  sigaddset((sigset_t *)local_98,0xd);
  pthread_sigmask(0,(__sigset_t *)local_98,(__sigset_t *)0x0);
  (**(code **)(set.__val[0xf] + 8))(*(undefined8 *)(set.__val[0xf] + 0x10));
  return (void *)0x0;
}

Assistant:

static void *
nni_plat_thr_main(void *arg)
{
	nni_plat_thr *thr = arg;
	sigset_t      set;

	// Suppress (block) SIGPIPE for this thread.
	sigemptyset(&set);
	sigaddset(&set, SIGPIPE);
	(void) pthread_sigmask(SIG_BLOCK, &set, NULL);

	thr->func(thr->arg);
	return (NULL);
}